

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_map_custom2_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_custom2_op_t fun,int n_tasks,
          void *userdata,_Bool inplace)

{
  ggml_tensor *tensor;
  ggml_map_custom2_op_params params;
  
  if (0 < n_tasks || n_tasks == -1) {
    if (inplace) {
      tensor = ggml_view_tensor(ctx,a);
    }
    else {
      tensor = ggml_dup_tensor(ctx,a);
    }
    params.fun = fun;
    params.n_tasks = n_tasks;
    params.userdata = userdata;
    ggml_set_op_params(tensor,&params,0x18);
    tensor->op = GGML_OP_MAP_CUSTOM2;
    tensor->src[0] = a;
    tensor->src[1] = b;
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x134f,
             "GGML_ASSERT(%s) failed","n_tasks == GGML_N_TASKS_MAX || n_tasks > 0");
}

Assistant:

static struct ggml_tensor * ggml_map_custom2_impl(
        struct ggml_context      * ctx,
        struct ggml_tensor       * a,
        struct ggml_tensor       * b,
        const  ggml_custom2_op_t   fun,
        int                        n_tasks,
        void                     * userdata,
        bool                       inplace) {
    GGML_ASSERT(n_tasks == GGML_N_TASKS_MAX || n_tasks > 0);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    struct ggml_map_custom2_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op     = GGML_OP_MAP_CUSTOM2;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}